

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::ColorPicker4(char *label,float *col,ImGuiColorEditFlags flags,float *ref_col)

{
  float *out_g;
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  ImDrawList *pIVar3;
  uint uVar4;
  ImU32 IVar5;
  ImU32 col_00;
  ImU32 IVar6;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined8 extraout_RAX;
  char *text_end;
  ImU32 col_01;
  char cVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  uint uVar11;
  byte bVar12;
  char cVar13;
  ImVec2 *pIVar14;
  ImGuiContext *g;
  bool bVar15;
  uint uVar16;
  int iVar17;
  float fVar18;
  float fVar19;
  undefined4 extraout_XMM0_Db;
  uint extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  ImVec2 IVar20;
  undefined4 extraout_XMM0_Db_02;
  float extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  ImVec2 p_min;
  ImVec2 pos;
  ImVec2 pos_00;
  undefined4 extraout_XMM0_Dc;
  uint extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dd;
  uint extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  float fVar21;
  float fVar22;
  ImVec2 p_max;
  ImVec2 gradient_p1;
  ImVec2 p_max_00;
  ImVec2 half_sz;
  ImVec2 half_sz_00;
  uint uVar27;
  uint uVar28;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar29;
  undefined1 auVar30 [12];
  undefined1 auVar31 [16];
  float fVar32;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar37;
  float local_278;
  float local_274;
  float V;
  uint local_26c;
  undefined1 local_268 [8];
  float fStack_260;
  float fStack_25c;
  float local_24c;
  undefined1 local_248 [8];
  float fStack_240;
  float fStack_23c;
  ImVec2 *local_238;
  float B;
  float G;
  float R;
  ImDrawList *local_220;
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  ImVec2 local_200;
  ImU32 local_1f4;
  uint local_1f0;
  float local_1ec;
  ImVec2 triangle_pc;
  ImVec2 triangle_pa;
  ImVec2 local_1b0;
  ImVec2 current_off_unrotated;
  float vv;
  float fStack_15c;
  ImVec2 local_158;
  ImVec2 picker_pos;
  float ww;
  float fStack_11c;
  ImVec2 tra;
  float uu;
  float fStack_f4;
  float local_f0;
  float local_ec;
  undefined1 local_e8 [8];
  float fStack_e0;
  float fStack_dc;
  undefined1 local_d8 [8];
  float fStack_d0;
  float fStack_cc;
  size_t local_c0;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  ImVec2 trc;
  float backup_initial_col [4];
  ImVec2 uv_white;
  ImVec2 trb;
  undefined1 auVar33 [16];
  
  pIVar2 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->WriteAccessed = true;
  if (pIVar1->SkipItems != false) {
    bVar12 = 0;
    goto LAB_0015ad42;
  }
  local_220 = pIVar1->DrawList;
  local_238 = (ImVec2 *)col;
  local_248._0_4_ = CalcItemWidth();
  local_248._4_4_ = extraout_XMM0_Db;
  fStack_240 = (float)extraout_XMM0_Dc;
  fStack_23c = (float)extraout_XMM0_Dd;
  (pIVar2->NextItemData).Flags = 0;
  PushID(label);
  BeginGroup();
  uVar11 = (uint)~flags >> 4 & 0x10 | flags;
  if ((flags & 8U) == 0) {
    ColorPickerOptionsPopup(&local_238->x,uVar11);
  }
  if ((flags & 0x6000000U) == 0) {
    uVar4 = pIVar2->ColorEditOptions & 0x6000000;
    uVar16 = 0x2000000;
    if (uVar4 != 0) {
      uVar16 = uVar4;
    }
    uVar11 = uVar11 | uVar16;
  }
  if ((uVar11 & 0x18000000) == 0) {
    uVar4 = pIVar2->ColorEditOptions & 0x18000000;
    uVar16 = 0x8000000;
    if (uVar4 != 0) {
      uVar16 = uVar4;
    }
    uVar11 = uVar11 | uVar16;
  }
  if ((uVar11 & 8) == 0) {
    uVar11 = uVar11 | pIVar2->ColorEditOptions & 0x10000U;
  }
  local_1f0 = uVar11 & 0x10002;
  bVar15 = local_1f0 == 0x10000;
  IVar20 = (pIVar1->DC).CursorPos;
  picker_pos = IVar20;
  fVar18 = GetFrameHeight();
  pIVar14 = local_238;
  fVar19 = (pIVar2->Style).ItemInnerSpacing.x;
  fVar29 = (float)local_248._0_4_ - (fVar18 + fVar19) * (float)(byte)(bVar15 + 1);
  uVar16 = -(uint)(fVar29 <= fVar18);
  uVar4 = local_248._4_4_ & extraout_XMM0_Db_00;
  uVar27 = (uint)fStack_240 & extraout_XMM0_Dc_00;
  uVar28 = (uint)fStack_23c & extraout_XMM0_Dd_00;
  fVar21 = (float)(uVar16 & (uint)fVar18 | ~uVar16 & (uint)fVar29);
  local_c0 = (ulong)((uVar11 & 2) == 0) * 4 + 0xc;
  memcpy(backup_initial_col,local_238,local_c0);
  local_24c = fVar21 * 0.08;
  local_98 = ZEXT416((uint)(fVar21 * 0.5));
  fVar22 = fVar21 * 0.5 - local_24c;
  _local_d8 = ZEXT416((uint)fVar22);
  local_1ec = IVar20.x;
  local_78 = fVar21 + local_1ec;
  _local_248 = ZEXT416((uint)(fVar19 + local_78));
  _fStack_260 = 0;
  local_268._0_4_ = IVar20.x;
  local_268._4_4_ = IVar20.y;
  fVar32 = (fVar18 + fVar21) * 0.5 + local_1ec;
  fVar29 = fVar21 * 0.5 + IVar20.y;
  triangle_pa.x = fVar22 - (float)(int)(fVar21 * 0.027);
  triangle_pa.y = 0.0;
  local_1b0.x = triangle_pa.x * -0.5;
  local_1b0.y = triangle_pa.x * -0.866025;
  triangle_pc.y = triangle_pa.x * 0.866025;
  local_278 = pIVar14->x;
  local_274 = pIVar14->y;
  V = pIVar14[1].x;
  B = V;
  G = local_274;
  R = local_278;
  local_200.x = fVar32;
  local_200.y = fVar29;
  triangle_pc.x = local_1b0.x;
  uStack_74 = uVar4;
  uStack_70 = uVar27;
  uStack_6c = uVar28;
  if ((uVar11 >> 0x1b & 1) == 0) {
    if ((uVar11 >> 0x1c & 1) != 0) {
      ColorConvertHSVtoRGB(local_278,local_274,V,&R,&G,&B);
    }
  }
  else {
    ColorConvertRGBtoHSV(local_278,local_274,V,&local_278,&local_274,&V);
    ColorEditRestoreHS(&pIVar14->x,&local_278,&local_274,&V);
  }
  local_218._4_4_ = extraout_XMM0_Db_00;
  local_218._0_4_ = fVar18 + (float)local_248._0_4_;
  fStack_210 = (float)extraout_XMM0_Dc_00;
  fStack_20c = (float)extraout_XMM0_Dd_00;
  PushItemFlag(8,true);
  local_88 = (float)local_268._4_4_;
  fStack_84 = (float)local_268._4_4_;
  fStack_80 = (float)local_268._4_4_;
  fStack_7c = (float)local_268._4_4_;
  local_e8._4_4_ = local_268._4_4_;
  local_e8._0_4_ = local_268._4_4_;
  fStack_e0 = (float)local_268._4_4_;
  fStack_dc = (float)local_268._4_4_;
  if ((uVar11 >> 0x1a & 1) == 0) {
    if ((uVar11 >> 0x19 & 1) == 0) {
      cVar7 = '\0';
      local_26c = 0;
      uVar16 = 0;
    }
    else {
      current_off_unrotated.y = fVar21;
      current_off_unrotated.x = fVar21;
      uVar16 = 0;
      InvisibleButton("sv",&current_off_unrotated,0);
      bVar15 = IsItemActive();
      if (bVar15) {
        auVar35._0_4_ = fVar21 + -1.0;
        IVar20 = (pIVar2->IO).MousePos;
        auVar23._0_4_ = IVar20.x - (float)local_268._0_4_;
        auVar23._4_4_ = IVar20.y - (float)local_268._4_4_;
        auVar23._8_4_ = 0.0 - fStack_260;
        auVar23._12_4_ = 0.0 - fStack_25c;
        auVar35._4_4_ = auVar35._0_4_;
        auVar35._8_4_ = auVar35._0_4_;
        auVar35._12_4_ = auVar35._0_4_;
        auVar35 = divps(auVar23,auVar35);
        V = 1.0;
        fVar29 = auVar35._0_4_;
        fVar22 = auVar35._4_4_;
        iVar10 = -(uint)(fVar29 < 0.0);
        iVar17 = -(uint)(fVar22 < 0.0);
        auVar34._4_4_ = iVar17;
        auVar34._0_4_ = iVar10;
        auVar34._8_4_ = iVar17;
        auVar34._12_4_ = iVar17;
        auVar33._8_8_ = auVar34._8_8_;
        auVar33._4_4_ = iVar10;
        auVar33._0_4_ = iVar10;
        uVar16 = movmskpd((int)CONCAT71(extraout_var,bVar15),auVar33);
        local_274 = 0.0;
        if (((uVar16 & 1) == 0) && (local_274 = 1.0, fVar29 <= 1.0)) {
          local_274 = fVar29;
        }
        if ((uVar16 & 2) == 0) {
          auVar30 = ZEXT812(0x3f800000);
          if (fVar22 <= auVar30._0_4_) {
            auVar30._4_8_ = auVar30._4_8_;
            auVar30._0_4_ = fVar22;
          }
          V = 1.0 - auVar30._0_4_;
        }
        IVar6 = pIVar2->ColorEditLastColor;
        current_off_unrotated = *pIVar14;
        IVar5 = ColorConvertFloat4ToU32((ImVec4 *)&current_off_unrotated);
        uVar16 = 1;
        if (IVar6 == IVar5) {
          local_278 = pIVar2->ColorEditLastHue;
        }
      }
      cVar7 = (char)uVar16;
      if ((uVar11 & 8) == 0) {
        OpenPopupOnItemClick("context",1);
      }
      current_off_unrotated.y = local_88;
      current_off_unrotated.x = (float)local_248._0_4_;
      SetCursorScreenPos(&current_off_unrotated);
      current_off_unrotated.y = fVar21;
      current_off_unrotated.x = fVar18;
      local_26c = 0;
      InvisibleButton("hue",&current_off_unrotated,0);
      bVar15 = IsItemActive();
      if (bVar15) {
        fVar29 = ((pIVar2->IO).MousePos.y - (float)local_e8._0_4_) / (fVar21 + -1.0);
        local_278 = 1.0;
        if (fVar29 <= 1.0) {
          local_278 = fVar29;
        }
        local_278 = (float)(~-(uint)(fVar29 < 0.0) & (uint)local_278);
        local_26c = (uint)CONCAT71(extraout_var_00,1);
        uVar16 = 1;
      }
    }
  }
  else {
    current_off_unrotated.y = fVar21;
    current_off_unrotated.x = (pIVar2->Style).ItemInnerSpacing.x + fVar21 + fVar18;
    cVar7 = '\0';
    InvisibleButton("hsv",&current_off_unrotated,0);
    bVar15 = IsItemActive();
    local_26c = 0;
    uVar16 = 0;
    if (bVar15) {
      fVar37 = (pIVar2->IO).MouseClickedPos[0].x - fVar32;
      fVar22 = (pIVar2->IO).MouseClickedPos[0].y - fVar29;
      fVar32 = (pIVar2->IO).MousePos.x - fVar32;
      fVar29 = (pIVar2->IO).MousePos.y - fVar29;
      local_b8 = ZEXT416((uint)fVar29);
      local_a8 = ZEXT416((uint)fVar22);
      fVar22 = fVar37 * fVar37 + fVar22 * fVar22;
      if ((fVar22 < ((float)local_d8._0_4_ + -1.0) * ((float)local_d8._0_4_ + -1.0)) ||
         (((float)local_98._0_4_ + 1.0) * ((float)local_98._0_4_ + 1.0) < fVar22)) {
        local_26c = 0;
      }
      else {
        fVar29 = atan2f(fVar29,fVar32);
        fVar29 = (fVar29 / 3.1415927) * 0.5;
        local_278 = (float)(~-(uint)(fVar29 < 0.0) & (uint)fVar29 |
                           (uint)(fVar29 + 1.0) & -(uint)(fVar29 < 0.0));
        local_26c = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
      }
      local_268._0_4_ = cosf(local_278 * -2.0 * 3.1415927);
      local_268._4_4_ = extraout_XMM0_Db_01;
      fStack_260 = (float)extraout_XMM0_Dc_01;
      fStack_25c = (float)extraout_XMM0_Dd_01;
      fVar29 = sinf(local_278 * -2.0 * 3.1415927);
      current_off_unrotated.x = (float)local_268._0_4_ * fVar37 + -(float)local_a8._0_4_ * fVar29;
      current_off_unrotated.y = fVar29 * fVar37 + (float)local_268._0_4_ * (float)local_a8._0_4_;
      bVar15 = ImTriangleContainsPoint(&triangle_pa,&local_1b0,&triangle_pc,&current_off_unrotated);
      if (bVar15) {
        current_off_unrotated.x = (float)local_268._0_4_ * fVar32 + -(float)local_b8._0_4_ * fVar29;
        current_off_unrotated.y = fVar29 * fVar32 + (float)local_268._0_4_ * (float)local_b8._0_4_;
        bVar15 = ImTriangleContainsPoint
                           (&triangle_pa,&local_1b0,&triangle_pc,&current_off_unrotated);
        if (!bVar15) {
          current_off_unrotated =
               ImTriangleClosestPoint(&triangle_pa,&local_1b0,&triangle_pc,&current_off_unrotated);
        }
        ImTriangleBarycentricCoords
                  (&triangle_pa,&local_1b0,&triangle_pc,&current_off_unrotated,&uu,&vv,&ww);
        fVar22 = 1.0 - vv;
        fVar29 = 1.0;
        if (fVar22 <= 1.0) {
          fVar29 = fVar22;
        }
        V = (float)(-(uint)(fVar22 < 0.0001) & 0x38d1b717 | ~-(uint)(fVar22 < 0.0001) & (uint)fVar29
                   );
        fVar22 = uu / V;
        fVar29 = 1.0;
        if (fVar22 <= 1.0) {
          fVar29 = fVar22;
        }
        local_274 = (float)(-(uint)(fVar22 < 0.0001) & 0x38d1b717 |
                           ~-(uint)(fVar22 < 0.0001) & (uint)fVar29);
        cVar7 = '\x01';
        uVar16 = 1;
      }
      else {
        cVar7 = '\0';
        uVar16 = local_26c;
      }
    }
    if ((uVar11 & 8) == 0) {
      OpenPopupOnItemClick("context",1);
    }
  }
  fVar19 = fVar19 + (float)local_218._0_4_;
  if (local_1f0 == 0x10000) {
    current_off_unrotated.y = local_88;
    current_off_unrotated.x = fVar19;
    SetCursorScreenPos(&current_off_unrotated);
    current_off_unrotated.y = fVar21;
    current_off_unrotated.x = fVar18;
    InvisibleButton("alpha",&current_off_unrotated,0);
    bVar15 = IsItemActive();
    if (bVar15) {
      fVar22 = ((pIVar2->IO).MousePos.y - (float)local_e8._0_4_) / (fVar21 + -1.0);
      fVar29 = 1.0;
      if (fVar22 <= 1.0) {
        fVar29 = fVar22;
      }
      pIVar14[1].y = (float)(-(uint)(fVar22 < 0.0) & 0x3f800000 |
                            ~-(uint)(fVar22 < 0.0) & (uint)(1.0 - fVar29));
      uVar16 = 1;
    }
  }
  PopItemFlag();
  if ((uVar11 >> 8 & 1) == 0) {
    SameLine(0.0,(pIVar2->Style).ItemInnerSpacing.x);
    BeginGroup();
  }
  if ((-1 < (char)uVar11) && (text_end = FindRenderedTextEnd(label,(char *)0x0), text_end != label))
  {
    if ((uVar11 >> 8 & 1) != 0) {
      SameLine(0.0,(pIVar2->Style).ItemInnerSpacing.x);
    }
    TextEx(label,text_end,0);
  }
  if ((uVar11 >> 8 & 1) == 0) {
    PushItemFlag(0x10,true);
    current_off_unrotated = *pIVar14;
    if ((char)uVar11 < '\0') {
      Text("Current");
    }
    IVar20.x = fVar18 * 3.0;
    IVar20.y = fVar18 * 2.0;
    fStack_260 = fVar18 * 0.0;
    local_268._0_4_ = IVar20.x;
    local_268._4_4_ = IVar20.y;
    fStack_25c = fVar18 * 0.0;
    ColorButton("##current",(ImVec4 *)&current_off_unrotated,uVar11 & 0x180e0040,IVar20);
    if (ref_col != (float *)0x0) {
      Text("Original");
      uu = ref_col[0];
      fStack_f4 = ref_col[1];
      local_f0 = ref_col[2];
      if ((uVar11 & 2) == 0) {
        local_ec = ref_col[3];
      }
      else {
        local_ec = 1.0;
      }
      bVar15 = ColorButton("##original",(ImVec4 *)&uu,uVar11 & 0x180e0040,(ImVec2)local_268);
      if (bVar15) {
        memcpy(pIVar14,ref_col,local_c0);
        uVar16 = 1;
      }
    }
    PopItemFlag();
    EndGroup();
  }
  out_g = &pIVar14->y;
  local_268 = (undefined1  [8])(pIVar14 + 1);
  if (((char)local_26c != '\0') || (cVar7 != '\0')) {
    if ((uVar11 >> 0x1b & 1) == 0) {
      if ((uVar11 >> 0x1c & 1) != 0) {
        pIVar14->x = local_278;
        pIVar14->y = local_274;
        pIVar14[1].x = V;
      }
    }
    else {
      ColorConvertHSVtoRGB(local_278,local_274,V,&pIVar14->x,out_g,&pIVar14[1].x);
      pIVar2->ColorEditLastHue = local_278;
      pIVar2->ColorEditLastSat = local_274;
      current_off_unrotated = *pIVar14;
      IVar6 = ColorConvertFloat4ToU32((ImVec4 *)&current_off_unrotated);
      pIVar2->ColorEditLastColor = IVar6;
    }
  }
  if ((uVar11 & 0x20) == 0) {
    fVar29 = fVar19;
    if (local_1f0 != 0x10000) {
      fVar29 = (float)local_248._0_4_;
    }
    PushItemWidth((fVar29 + fVar18) - local_1ec);
    uVar8 = uVar11 & 0x198e001a;
    cVar13 = '\x01';
    if (((uVar11 >> 0x14 & 1) != 0 || (uVar11 & 0x600000) == 0) &&
       (bVar15 = ColorEdit4("##rgb",&local_238->x,uVar8 | 0x100004), bVar15)) {
      uVar16 = 1;
      if (pIVar2->ActiveId == 0) {
        cVar13 = '\x01';
      }
      else {
        cVar13 = pIVar2->ActiveIdAllowOverlap;
      }
    }
    if ((uVar11 >> 0x15 & 1) != 0 || (uVar11 & 0x500000) == 0) {
      bVar15 = ColorEdit4("##hsv",&local_238->x,uVar8 | 0x200004);
      uVar16 = (uint)(byte)((byte)uVar16 | bVar15);
    }
    if ((uVar11 >> 0x16 & 1) != 0 || (uVar11 & 0x300000) == 0) {
      bVar15 = ColorEdit4("##hex",&local_238->x,uVar8 | 0x400004);
      uVar16 = (uint)(byte)((byte)uVar16 | bVar15);
    }
    PopItemWidth();
    pIVar14 = local_238;
    if ((uVar11 >> 0x1b & 1) != 0 && cVar13 == '\0') {
      ColorConvertRGBtoHSV
                (local_238->x,local_238->y,local_238[1].x,&current_off_unrotated.x,&uu,&vv);
      if ((current_off_unrotated.x <= 0.0) && (0.0 < local_278)) {
        if (0.0 < vv) {
LAB_0015a0ea:
          if (0.0 < uu) goto LAB_0015a11f;
          fVar29 = local_274 * 0.5;
        }
        else {
          if ((V == vv) && (!NAN(V) && !NAN(vv))) goto LAB_0015a0ea;
          vv = V * 0.5;
          fVar29 = local_274;
        }
        ColorConvertHSVtoRGB(local_278,fVar29,vv,&pIVar14->x,out_g,(float *)local_268);
      }
    }
  }
LAB_0015a11f:
  local_a8 = ZEXT416((uint)(float)(int)(fVar18 * 0.2));
  if ((char)uVar16 != '\0') {
    if ((uVar11 >> 0x1b & 1) == 0) {
      if ((uVar11 >> 0x1c & 1) != 0) {
        local_278 = pIVar14->x;
        local_274 = pIVar14->y;
        V = pIVar14[1].x;
        ColorConvertHSVtoRGB(local_278,local_274,V,&R,&G,&B);
      }
    }
    else {
      R = pIVar14->x;
      G = pIVar14->y;
      B = pIVar14[1].x;
      ColorConvertRGBtoHSV(R,G,B,&local_278,&local_274,&V);
      ColorEditRestoreHS(&pIVar14->x,&local_278,&local_274,&V);
    }
  }
  local_ec = (pIVar2->Style).Alpha;
  fVar29 = 1.0;
  if (local_ec <= 1.0) {
    fVar29 = local_ec;
  }
  iVar10 = (int)((float)(~-(uint)(local_ec < 0.0) & (uint)fVar29) * 255.0 + 0.5);
  uu = 1.0;
  fStack_f4 = 1.0;
  local_f0 = 1.0;
  local_b8._0_4_ = iVar10 * 0x1000000;
  local_b8._4_4_ = 0;
  local_268 = (undefined1  [8])(CONCAT44(iVar10 << 0x18,iVar10 << 0x18) | 0xffff000000ff);
  fStack_260 = (float)(iVar10 << 0x18 | 0xff00);
  fStack_25c = (float)(iVar10 << 0x18 | 0xffff00);
  col_01 = local_b8._0_4_ + 0xffffff;
  current_off_unrotated = (ImVec2)(CONCAT44(iVar10 << 0x18,iVar10 << 0x18) | 0xffff000000ff);
  IVar5 = local_b8._0_4_ + 0x808080;
  ColorConvertHSVtoRGB(local_278,1.0,1.0,&uu,&fStack_f4,&local_f0);
  col_00 = ColorConvertFloat4ToU32((ImVec4 *)&uu);
  fStack_15c = G;
  vv = R;
  local_158.y = (pIVar2->Style).Alpha;
  local_158.x = B;
  IVar6 = ColorConvertFloat4ToU32((ImVec4 *)&vv);
  pIVar3 = local_220;
  ww = 0.0;
  fStack_11c = 0.0;
  fVar29 = (float)local_268._0_4_;
  if ((uVar11 >> 0x1a & 1) == 0) {
    if ((uVar11 >> 0x19 & 1) != 0) {
      fStack_15c = (float)local_e8._0_4_ + fVar21;
      vv = local_78;
      local_1f4 = IVar6;
      ImDrawList::AddRectFilledMultiColor
                (local_220,&picker_pos,(ImVec2 *)&vv,col_01,col_00,col_00,col_01);
      local_268._4_4_ = fVar21;
      local_268._0_4_ = fVar21;
      fStack_260 = fVar21;
      fStack_25c = fVar21;
      vv = picker_pos.x + fVar21;
      fStack_15c = picker_pos.y + fVar21;
      ImDrawList::AddRectFilledMultiColor
                (pIVar3,&picker_pos,(ImVec2 *)&vv,0,0,local_b8._0_4_,local_b8._0_4_);
      p_max.x = (float)local_268._0_4_ + picker_pos.x;
      p_max.y = (float)local_268._4_4_ + picker_pos.y;
      RenderFrameBorder(picker_pos,p_max,0.0);
      auVar31._4_4_ = 1.0 - V;
      auVar31._0_4_ = local_274;
      auVar31._8_8_ = 0;
      auVar35 = minps(_DAT_0016c750,auVar31);
      fVar22 = picker_pos.x;
      fVar32 = picker_pos.y;
      auVar24._0_4_ =
           (float)(int)((float)(-(uint)(0.0 <= local_274) & auVar35._0_4_) * (float)local_268._0_4_
                        + fVar22 + 0.5);
      auVar24._4_4_ =
           (float)(int)((float)(-(uint)(0.0 <= 1.0 - V) & auVar35._4_4_) * (float)local_268._4_4_ +
                        fVar32 + 0.5);
      auVar24._8_4_ = (float)(int)(auVar35._8_4_ * fStack_260 + 0.0 + 0.0);
      auVar24._12_4_ = (float)(int)(auVar35._12_4_ * fStack_25c + 0.0 + 0.0);
      auVar36._0_4_ = (float)local_268._0_4_ + fVar22 + -2.0;
      auVar36._4_4_ = (float)local_268._4_4_ + fVar32 + -2.0;
      auVar36._8_4_ = fStack_260 + 0.0 + 0.0;
      auVar36._12_4_ = fStack_25c + 0.0 + 0.0;
      auVar35 = minps(auVar36,auVar24);
      uVar11 = -(uint)(auVar24._0_4_ < fVar22 + 2.0);
      uVar8 = -(uint)(auVar24._4_4_ < fVar32 + 2.0);
      fStack_11c = (float)(~uVar8 & auVar35._4_4_ | (uint)(fVar32 + 2.0) & uVar8);
      ww = (float)(~uVar11 & auVar35._0_4_ | (uint)(fVar22 + 2.0) & uVar11);
      local_268._4_4_ = uVar4;
      local_268._0_4_ = fVar21 / 6.0;
      fStack_260 = (float)uVar27;
      fStack_25c = (float)uVar28;
      lVar9 = 0;
      while( true ) {
        if (lVar9 == 6) break;
        fStack_15c = (float)(int)lVar9 * (float)local_268._0_4_ + picker_pos.y;
        vv = (float)local_248._0_4_;
        tra.y = (float)(int)(lVar9 + 1) * (float)local_268._0_4_ + picker_pos.y;
        tra.x = (float)local_218._0_4_;
        fVar22 = (&current_off_unrotated.y)[lVar9];
        ImDrawList::AddRectFilledMultiColor
                  (local_220,(ImVec2 *)&vv,&tra,(ImU32)fVar29,(ImU32)fVar29,(ImU32)fVar22,
                   (ImU32)fVar22);
        lVar9 = lVar9 + 1;
        fVar29 = fVar22;
      }
      _local_268 = ZEXT416((uint)(float)(int)(local_278 * fVar21 + picker_pos.y + 0.5));
      p_min.y = picker_pos.y;
      p_min.x = (float)local_248._0_4_;
      p_max_00.y = fVar21 + picker_pos.y;
      p_max_00.x = (float)local_218._0_4_;
      RenderFrameBorder(p_min,p_max_00,0.0);
      pos.x = (float)local_248._0_4_ + -1.0;
      pos.y = (float)local_268._0_4_;
      half_sz.x = (float)local_a8._0_4_ + 1.0;
      half_sz.y = (float)local_a8._0_4_;
      RenderArrowsForVerticalBar(local_220,pos,half_sz,fVar18 + 2.0,(pIVar2->Style).Alpha);
      IVar6 = local_1f4;
    }
  }
  else {
    _local_e8 = ZEXT416((uint)(0.5 / (float)local_98._0_4_));
    local_1ec = 5.60519e-45;
    if (4 < (int)(float)local_98._0_4_ / 0xc) {
      local_1ec = (float)((int)(float)local_98._0_4_ / 0xc);
    }
    local_78 = -(0.5 / (float)local_98._0_4_);
    uStack_74 = 0x80000000;
    uStack_70 = 0x80000000;
    uStack_6c = 0x80000000;
    local_98._0_4_ = (float)local_98._0_4_ + (float)local_d8._0_4_;
    local_88 = (float)local_98._0_4_ * 0.5;
    local_d8._4_4_ = local_d8._0_4_;
    fStack_d0 = (float)local_d8._0_4_;
    fStack_cc = (float)local_d8._0_4_;
    local_1f4 = IVar6;
    for (lVar9 = 0; lVar9 != 6; lVar9 = lVar9 + 1) {
      fVar22 = (float)(int)lVar9 / 6.0;
      fVar32 = (fVar22 + fVar22) * 3.1415927 + local_78;
      fVar22 = ((float)(int)lVar9 + 1.0) / 6.0;
      fVar22 = (fVar22 + fVar22) * 3.1415927 + (float)local_e8._0_4_;
      local_268._0_4_ = fVar22;
      iVar10 = (pIVar3->VtxBuffer).Size;
      ImDrawList::PathArcTo(pIVar3,&local_200,local_88,fVar32,fVar22,(int)local_1ec);
      ImDrawList::PathStroke(pIVar3,col_01,0,local_24c);
      iVar17 = (pIVar3->VtxBuffer).Size;
      _local_218 = ZEXT416((uint)local_200.x);
      local_248._0_4_ = cosf(fVar32);
      local_248._4_4_ = extraout_XMM0_Db_02;
      fStack_240 = (float)extraout_XMM0_Dc_02;
      fStack_23c = (float)extraout_XMM0_Dd_02;
      auVar25._4_4_ = local_200.y;
      auVar25._0_4_ = local_218._0_4_;
      auVar25._8_4_ = local_218._4_4_;
      auVar25._12_4_ = 0;
      _local_218 = auVar25;
      fVar22 = sinf(fVar32);
      fVar32 = (float)local_248._4_4_ * fStack_d0;
      local_248._4_4_ = fVar22 * (float)local_d8._4_4_ + (float)local_218._4_4_;
      local_248._0_4_ = (float)local_248._0_4_ * (float)local_d8._0_4_ + (float)local_218._0_4_;
      fStack_240 = fVar32 + fStack_210;
      fStack_23c = extraout_XMM0_Db_03 * fStack_cc + fStack_20c;
      _local_218 = ZEXT416((uint)local_200.x);
      fVar22 = cosf((float)local_268._0_4_);
      auVar26._4_4_ = local_200.y;
      auVar26._0_4_ = local_218._0_4_;
      auVar26._8_4_ = local_218._4_4_;
      auVar26._12_4_ = 0;
      _local_218 = auVar26;
      fVar32 = sinf((float)local_268._0_4_);
      gradient_p1.x = fVar22 * (float)local_d8._0_4_ + (float)local_218._0_4_;
      gradient_p1.y = fVar32 * (float)local_d8._4_4_ + (float)local_218._4_4_;
      fVar22 = (&current_off_unrotated.y)[lVar9];
      ShadeVertsLinearColorGradientKeepAlpha
                (pIVar3,iVar10,iVar17,(ImVec2)local_248,gradient_p1,(ImU32)fVar29,(ImU32)fVar22);
      fVar29 = fVar22;
    }
    local_248._0_4_ = cosf((local_278 + local_278) * 3.1415927);
    local_248._4_4_ = extraout_XMM0_Db_04;
    fStack_240 = (float)extraout_XMM0_Dc_03;
    fStack_23c = (float)extraout_XMM0_Dd_03;
    local_218._0_4_ = sinf((local_278 + local_278) * 3.1415927);
    pIVar3 = local_220;
    local_218._4_4_ = extraout_XMM0_Db_05;
    fStack_210 = (float)extraout_XMM0_Dc_04;
    fStack_20c = (float)extraout_XMM0_Dd_04;
    vv = (float)local_248._0_4_ * (float)local_98._0_4_ * 0.5 + local_200.x;
    fStack_15c = (float)local_218._0_4_ * (float)local_98._0_4_ * 0.5 + local_200.y;
    if ((char)local_26c == '\0') {
      fVar29 = 0.55;
    }
    else {
      fVar29 = 0.65;
    }
    local_24c = local_24c * fVar29;
    iVar10 = 0x20;
    if ((int)(local_24c / 1.4) < 0x20) {
      iVar10 = (int)(local_24c / 1.4);
    }
    iVar17 = 9;
    if (9 < iVar10) {
      iVar17 = iVar10;
    }
    ImDrawList::AddCircleFilled(local_220,(ImVec2 *)&vv,local_24c,col_00,iVar17);
    ImDrawList::AddCircle(pIVar3,(ImVec2 *)&vv,local_24c + 1.0,IVar5,iVar17,1.0);
    ImDrawList::AddCircle(pIVar3,(ImVec2 *)&vv,local_24c,col_01,iVar17,1.0);
    tra.x = triangle_pa.x * (float)local_248._0_4_ + -triangle_pa.y * (float)local_218._0_4_ +
            local_200.x;
    tra.y = triangle_pa.x * (float)local_218._0_4_ + triangle_pa.y * (float)local_248._0_4_ +
            local_200.y;
    trb.x = local_1b0.x * (float)local_248._0_4_ + -local_1b0.y * (float)local_218._0_4_ +
            local_200.x;
    trb.y = local_1b0.x * (float)local_218._0_4_ + local_1b0.y * (float)local_248._0_4_ +
            local_200.y;
    trc.x = triangle_pc.x * (float)local_248._0_4_ + -triangle_pc.y * (float)local_218._0_4_ +
            local_200.x;
    trc.y = triangle_pc.x * (float)local_218._0_4_ + triangle_pc.y * (float)local_248._0_4_ +
            local_200.y;
    uv_white = GetFontTexUvWhitePixel();
    ImDrawList::PrimReserve(pIVar3,6,6);
    ImDrawList::PrimVtx(pIVar3,&tra,&uv_white,col_00);
    ImDrawList::PrimVtx(pIVar3,&trb,&uv_white,col_00);
    ImDrawList::PrimVtx(pIVar3,&trc,&uv_white,col_01);
    ImDrawList::PrimVtx(pIVar3,&tra,&uv_white,0);
    ImDrawList::PrimVtx(pIVar3,&trb,&uv_white,local_b8._0_4_);
    ImDrawList::PrimVtx(pIVar3,&trc,&uv_white,0);
    ImDrawList::AddTriangle(pIVar3,&tra,&trb,&trc,IVar5,1.5);
    fVar29 = 1.0;
    if (local_274 <= 1.0) {
      fVar29 = local_274;
    }
    fVar29 = (float)(~-(uint)(local_274 < 0.0) & (uint)fVar29);
    fVar32 = 1.0 - V;
    fVar22 = 1.0;
    if (fVar32 <= 1.0) {
      fVar22 = fVar32;
    }
    fVar22 = (float)(~-(uint)(fVar32 < 0.0) & (uint)fVar22);
    fVar32 = fVar29 * (tra.x - trc.x) + trc.x;
    fVar29 = fVar29 * (tra.y - trc.y) + trc.y;
    ww = fVar22 * (trb.x - fVar32) + fVar32;
    fStack_11c = fVar22 * (trb.y - fVar29) + fVar29;
    IVar6 = local_1f4;
  }
  pIVar3 = local_220;
  pIVar14 = local_238;
  if (cVar7 == '\0') {
    fVar29 = 6.0;
  }
  else {
    fVar29 = 10.0;
  }
  local_248._0_4_ = fVar29;
  ImDrawList::AddCircleFilled(local_220,(ImVec2 *)&ww,fVar29,IVar6,0xc);
  ImDrawList::AddCircle(pIVar3,(ImVec2 *)&ww,(float)local_248._0_4_ + 1.0,IVar5,0xc,1.0);
  ImDrawList::AddCircle(pIVar3,(ImVec2 *)&ww,(float)local_248._0_4_,col_01,0xc,1.0);
  if (local_1f0 == 0x10000) {
    fVar29 = pIVar14[1].y;
    _local_218 = ZEXT416((uint)fVar29);
    fVar22 = 1.0;
    if (fVar29 <= 1.0) {
      fVar22 = fVar29;
    }
    _local_248 = ZEXT416((uint)(1.0 - fVar22));
    fStack_15c = picker_pos.y;
    vv = fVar19;
    local_158.x = fVar19 + fVar18;
    local_158.y = picker_pos.y + fVar21;
    RenderColorRectWithAlphaCheckerboard
              (pIVar3,_vv,local_158,0,(local_158.x - fVar19) * 0.5,(ImVec2)0x0,0.0,0);
    ImDrawList::AddRectFilledMultiColor
              (pIVar3,(ImVec2 *)&vv,&local_158,IVar6,IVar6,IVar6 & 0xffffff,IVar6 & 0xffffff);
    pIVar14 = local_238;
    local_248._4_4_ = (float)(int)(float)(~local_218._4_4_ & local_248._4_4_);
    local_248._0_4_ =
         (float)(int)((float)(-(uint)((float)local_218._0_4_ < 0.0) & 0x3f800000 |
                             ~-(uint)((float)local_218._0_4_ < 0.0) & local_248._0_4_) * fVar21 +
                      picker_pos.y + 0.5);
    fStack_240 = (float)(int)(float)(~(uint)fStack_210 & (uint)fStack_240);
    fStack_23c = (float)(int)(float)(~(uint)fStack_20c & (uint)fStack_23c);
    RenderFrameBorder(_vv,local_158,0.0);
    pos_00.x = fVar19 + -1.0;
    pos_00.y = (float)local_248._0_4_;
    half_sz_00.x = (float)local_a8._0_4_ + 1.0;
    half_sz_00.y = (float)local_a8._0_4_;
    RenderArrowsForVerticalBar(pIVar3,pos_00,half_sz_00,fVar18 + 2.0,(pIVar2->Style).Alpha);
  }
  EndGroup();
  if ((char)uVar16 != '\0') {
    iVar10 = bcmp(backup_initial_col,pIVar14,local_c0);
    uVar16 = uVar16 & 0xff;
    if (iVar10 == 0) {
      uVar16 = 0;
    }
  }
  bVar12 = (byte)uVar16;
  if ((uVar16 & 1) != 0) {
    MarkItemEdited((pIVar2->LastItemData).ID);
  }
  PopID();
LAB_0015ad42:
  return (bool)(bVar12 & 1);
}

Assistant:

bool ImGui::ColorPicker4(const char* label, float col[4], ImGuiColorEditFlags flags, const float* ref_col)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImDrawList* draw_list = window->DrawList;
    ImGuiStyle& style = g.Style;
    ImGuiIO& io = g.IO;

    const float width = CalcItemWidth();
    g.NextItemData.ClearFlags();

    PushID(label);
    BeginGroup();

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
        flags |= ImGuiColorEditFlags_NoSmallPreview;

    // Context menu: display and store options.
    if (!(flags & ImGuiColorEditFlags_NoOptions))
        ColorPickerOptionsPopup(col, flags);

    // Read stored options
    if (!(flags & ImGuiColorEditFlags_PickerMask_))
        flags |= ((g.ColorEditOptions & ImGuiColorEditFlags_PickerMask_) ? g.ColorEditOptions : ImGuiColorEditFlags_DefaultOptions_) & ImGuiColorEditFlags_PickerMask_;
    if (!(flags & ImGuiColorEditFlags_InputMask_))
        flags |= ((g.ColorEditOptions & ImGuiColorEditFlags_InputMask_) ? g.ColorEditOptions : ImGuiColorEditFlags_DefaultOptions_) & ImGuiColorEditFlags_InputMask_;
    IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiColorEditFlags_PickerMask_)); // Check that only 1 is selected
    IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiColorEditFlags_InputMask_));  // Check that only 1 is selected
    if (!(flags & ImGuiColorEditFlags_NoOptions))
        flags |= (g.ColorEditOptions & ImGuiColorEditFlags_AlphaBar);

    // Setup
    int components = (flags & ImGuiColorEditFlags_NoAlpha) ? 3 : 4;
    bool alpha_bar = (flags & ImGuiColorEditFlags_AlphaBar) && !(flags & ImGuiColorEditFlags_NoAlpha);
    ImVec2 picker_pos = window->DC.CursorPos;
    float square_sz = GetFrameHeight();
    float bars_width = square_sz; // Arbitrary smallish width of Hue/Alpha picking bars
    float sv_picker_size = ImMax(bars_width * 1, width - (alpha_bar ? 2 : 1) * (bars_width + style.ItemInnerSpacing.x)); // Saturation/Value picking box
    float bar0_pos_x = picker_pos.x + sv_picker_size + style.ItemInnerSpacing.x;
    float bar1_pos_x = bar0_pos_x + bars_width + style.ItemInnerSpacing.x;
    float bars_triangles_half_sz = IM_FLOOR(bars_width * 0.20f);

    float backup_initial_col[4];
    memcpy(backup_initial_col, col, components * sizeof(float));

    float wheel_thickness = sv_picker_size * 0.08f;
    float wheel_r_outer = sv_picker_size * 0.50f;
    float wheel_r_inner = wheel_r_outer - wheel_thickness;
    ImVec2 wheel_center(picker_pos.x + (sv_picker_size + bars_width)*0.5f, picker_pos.y + sv_picker_size * 0.5f);

    // Note: the triangle is displayed rotated with triangle_pa pointing to Hue, but most coordinates stays unrotated for logic.
    float triangle_r = wheel_r_inner - (int)(sv_picker_size * 0.027f);
    ImVec2 triangle_pa = ImVec2(triangle_r, 0.0f); // Hue point.
    ImVec2 triangle_pb = ImVec2(triangle_r * -0.5f, triangle_r * -0.866025f); // Black point.
    ImVec2 triangle_pc = ImVec2(triangle_r * -0.5f, triangle_r * +0.866025f); // White point.

    float H = col[0], S = col[1], V = col[2];
    float R = col[0], G = col[1], B = col[2];
    if (flags & ImGuiColorEditFlags_InputRGB)
    {
        // Hue is lost when converting from greyscale rgb (saturation=0). Restore it.
        ColorConvertRGBtoHSV(R, G, B, H, S, V);
        ColorEditRestoreHS(col, &H, &S, &V);
    }
    else if (flags & ImGuiColorEditFlags_InputHSV)
    {
        ColorConvertHSVtoRGB(H, S, V, R, G, B);
    }

    bool value_changed = false, value_changed_h = false, value_changed_sv = false;

    PushItemFlag(ImGuiItemFlags_NoNav, true);
    if (flags & ImGuiColorEditFlags_PickerHueWheel)
    {
        // Hue wheel + SV triangle logic
        InvisibleButton("hsv", ImVec2(sv_picker_size + style.ItemInnerSpacing.x + bars_width, sv_picker_size));
        if (IsItemActive())
        {
            ImVec2 initial_off = g.IO.MouseClickedPos[0] - wheel_center;
            ImVec2 current_off = g.IO.MousePos - wheel_center;
            float initial_dist2 = ImLengthSqr(initial_off);
            if (initial_dist2 >= (wheel_r_inner - 1) * (wheel_r_inner - 1) && initial_dist2 <= (wheel_r_outer + 1) * (wheel_r_outer + 1))
            {
                // Interactive with Hue wheel
                H = ImAtan2(current_off.y, current_off.x) / IM_PI * 0.5f;
                if (H < 0.0f)
                    H += 1.0f;
                value_changed = value_changed_h = true;
            }
            float cos_hue_angle = ImCos(-H * 2.0f * IM_PI);
            float sin_hue_angle = ImSin(-H * 2.0f * IM_PI);
            if (ImTriangleContainsPoint(triangle_pa, triangle_pb, triangle_pc, ImRotate(initial_off, cos_hue_angle, sin_hue_angle)))
            {
                // Interacting with SV triangle
                ImVec2 current_off_unrotated = ImRotate(current_off, cos_hue_angle, sin_hue_angle);
                if (!ImTriangleContainsPoint(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated))
                    current_off_unrotated = ImTriangleClosestPoint(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated);
                float uu, vv, ww;
                ImTriangleBarycentricCoords(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated, uu, vv, ww);
                V = ImClamp(1.0f - vv, 0.0001f, 1.0f);
                S = ImClamp(uu / V, 0.0001f, 1.0f);
                value_changed = value_changed_sv = true;
            }
        }
        if (!(flags & ImGuiColorEditFlags_NoOptions))
            OpenPopupOnItemClick("context", ImGuiPopupFlags_MouseButtonRight);
    }
    else if (flags & ImGuiColorEditFlags_PickerHueBar)
    {
        // SV rectangle logic
        InvisibleButton("sv", ImVec2(sv_picker_size, sv_picker_size));
        if (IsItemActive())
        {
            S = ImSaturate((io.MousePos.x - picker_pos.x) / (sv_picker_size - 1));
            V = 1.0f - ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size - 1));

            // Greatly reduces hue jitter and reset to 0 when hue == 255 and color is rapidly modified using SV square.
            if (g.ColorEditLastColor == ColorConvertFloat4ToU32(ImVec4(col[0], col[1], col[2], 0)))
                H = g.ColorEditLastHue;
            value_changed = value_changed_sv = true;
        }
        if (!(flags & ImGuiColorEditFlags_NoOptions))
            OpenPopupOnItemClick("context", ImGuiPopupFlags_MouseButtonRight);

        // Hue bar logic
        SetCursorScreenPos(ImVec2(bar0_pos_x, picker_pos.y));
        InvisibleButton("hue", ImVec2(bars_width, sv_picker_size));
        if (IsItemActive())
        {
            H = ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size - 1));
            value_changed = value_changed_h = true;
        }
    }

    // Alpha bar logic
    if (alpha_bar)
    {
        SetCursorScreenPos(ImVec2(bar1_pos_x, picker_pos.y));
        InvisibleButton("alpha", ImVec2(bars_width, sv_picker_size));
        if (IsItemActive())
        {
            col[3] = 1.0f - ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size - 1));
            value_changed = true;
        }
    }
    PopItemFlag(); // ImGuiItemFlags_NoNav

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
    {
        SameLine(0, style.ItemInnerSpacing.x);
        BeginGroup();
    }

    if (!(flags & ImGuiColorEditFlags_NoLabel))
    {
        const char* label_display_end = FindRenderedTextEnd(label);
        if (label != label_display_end)
        {
            if ((flags & ImGuiColorEditFlags_NoSidePreview))
                SameLine(0, style.ItemInnerSpacing.x);
            TextEx(label, label_display_end);
        }
    }

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
    {
        PushItemFlag(ImGuiItemFlags_NoNavDefaultFocus, true);
        ImVec4 col_v4(col[0], col[1], col[2], (flags & ImGuiColorEditFlags_NoAlpha) ? 1.0f : col[3]);
        if ((flags & ImGuiColorEditFlags_NoLabel))
            Text("Current");

        ImGuiColorEditFlags sub_flags_to_forward = ImGuiColorEditFlags_InputMask_ | ImGuiColorEditFlags_HDR | ImGuiColorEditFlags_AlphaPreview | ImGuiColorEditFlags_AlphaPreviewHalf | ImGuiColorEditFlags_NoTooltip;
        ColorButton("##current", col_v4, (flags & sub_flags_to_forward), ImVec2(square_sz * 3, square_sz * 2));
        if (ref_col != NULL)
        {
            Text("Original");
            ImVec4 ref_col_v4(ref_col[0], ref_col[1], ref_col[2], (flags & ImGuiColorEditFlags_NoAlpha) ? 1.0f : ref_col[3]);
            if (ColorButton("##original", ref_col_v4, (flags & sub_flags_to_forward), ImVec2(square_sz * 3, square_sz * 2)))
            {
                memcpy(col, ref_col, components * sizeof(float));
                value_changed = true;
            }
        }
        PopItemFlag();
        EndGroup();
    }

    // Convert back color to RGB
    if (value_changed_h || value_changed_sv)
    {
        if (flags & ImGuiColorEditFlags_InputRGB)
        {
            ColorConvertHSVtoRGB(H, S, V, col[0], col[1], col[2]);
            g.ColorEditLastHue = H;
            g.ColorEditLastSat = S;
            g.ColorEditLastColor = ColorConvertFloat4ToU32(ImVec4(col[0], col[1], col[2], 0));
        }
        else if (flags & ImGuiColorEditFlags_InputHSV)
        {
            col[0] = H;
            col[1] = S;
            col[2] = V;
        }
    }

    // R,G,B and H,S,V slider color editor
    bool value_changed_fix_hue_wrap = false;
    if ((flags & ImGuiColorEditFlags_NoInputs) == 0)
    {
        PushItemWidth((alpha_bar ? bar1_pos_x : bar0_pos_x) + bars_width - picker_pos.x);
        ImGuiColorEditFlags sub_flags_to_forward = ImGuiColorEditFlags_DataTypeMask_ | ImGuiColorEditFlags_InputMask_ | ImGuiColorEditFlags_HDR | ImGuiColorEditFlags_NoAlpha | ImGuiColorEditFlags_NoOptions | ImGuiColorEditFlags_NoSmallPreview | ImGuiColorEditFlags_AlphaPreview | ImGuiColorEditFlags_AlphaPreviewHalf;
        ImGuiColorEditFlags sub_flags = (flags & sub_flags_to_forward) | ImGuiColorEditFlags_NoPicker;
        if (flags & ImGuiColorEditFlags_DisplayRGB || (flags & ImGuiColorEditFlags_DisplayMask_) == 0)
            if (ColorEdit4("##rgb", col, sub_flags | ImGuiColorEditFlags_DisplayRGB))
            {
                // FIXME: Hackily differentiating using the DragInt (ActiveId != 0 && !ActiveIdAllowOverlap) vs. using the InputText or DropTarget.
                // For the later we don't want to run the hue-wrap canceling code. If you are well versed in HSV picker please provide your input! (See #2050)
                value_changed_fix_hue_wrap = (g.ActiveId != 0 && !g.ActiveIdAllowOverlap);
                value_changed = true;
            }
        if (flags & ImGuiColorEditFlags_DisplayHSV || (flags & ImGuiColorEditFlags_DisplayMask_) == 0)
            value_changed |= ColorEdit4("##hsv", col, sub_flags | ImGuiColorEditFlags_DisplayHSV);
        if (flags & ImGuiColorEditFlags_DisplayHex || (flags & ImGuiColorEditFlags_DisplayMask_) == 0)
            value_changed |= ColorEdit4("##hex", col, sub_flags | ImGuiColorEditFlags_DisplayHex);
        PopItemWidth();
    }

    // Try to cancel hue wrap (after ColorEdit4 call), if any
    if (value_changed_fix_hue_wrap && (flags & ImGuiColorEditFlags_InputRGB))
    {
        float new_H, new_S, new_V;
        ColorConvertRGBtoHSV(col[0], col[1], col[2], new_H, new_S, new_V);
        if (new_H <= 0 && H > 0)
        {
            if (new_V <= 0 && V != new_V)
                ColorConvertHSVtoRGB(H, S, new_V <= 0 ? V * 0.5f : new_V, col[0], col[1], col[2]);
            else if (new_S <= 0)
                ColorConvertHSVtoRGB(H, new_S <= 0 ? S * 0.5f : new_S, new_V, col[0], col[1], col[2]);
        }
    }

    if (value_changed)
    {
        if (flags & ImGuiColorEditFlags_InputRGB)
        {
            R = col[0];
            G = col[1];
            B = col[2];
            ColorConvertRGBtoHSV(R, G, B, H, S, V);
            ColorEditRestoreHS(col, &H, &S, &V);   // Fix local Hue as display below will use it immediately.
        }
        else if (flags & ImGuiColorEditFlags_InputHSV)
        {
            H = col[0];
            S = col[1];
            V = col[2];
            ColorConvertHSVtoRGB(H, S, V, R, G, B);
        }
    }

    const int style_alpha8 = IM_F32_TO_INT8_SAT(style.Alpha);
    const ImU32 col_black = IM_COL32(0,0,0,style_alpha8);
    const ImU32 col_white = IM_COL32(255,255,255,style_alpha8);
    const ImU32 col_midgrey = IM_COL32(128,128,128,style_alpha8);
    const ImU32 col_hues[6 + 1] = { IM_COL32(255,0,0,style_alpha8), IM_COL32(255,255,0,style_alpha8), IM_COL32(0,255,0,style_alpha8), IM_COL32(0,255,255,style_alpha8), IM_COL32(0,0,255,style_alpha8), IM_COL32(255,0,255,style_alpha8), IM_COL32(255,0,0,style_alpha8) };

    ImVec4 hue_color_f(1, 1, 1, style.Alpha); ColorConvertHSVtoRGB(H, 1, 1, hue_color_f.x, hue_color_f.y, hue_color_f.z);
    ImU32 hue_color32 = ColorConvertFloat4ToU32(hue_color_f);
    ImU32 user_col32_striped_of_alpha = ColorConvertFloat4ToU32(ImVec4(R, G, B, style.Alpha)); // Important: this is still including the main rendering/style alpha!!

    ImVec2 sv_cursor_pos;

    if (flags & ImGuiColorEditFlags_PickerHueWheel)
    {
        // Render Hue Wheel
        const float aeps = 0.5f / wheel_r_outer; // Half a pixel arc length in radians (2pi cancels out).
        const int segment_per_arc = ImMax(4, (int)wheel_r_outer / 12);
        for (int n = 0; n < 6; n++)
        {
            const float a0 = (n)     /6.0f * 2.0f * IM_PI - aeps;
            const float a1 = (n+1.0f)/6.0f * 2.0f * IM_PI + aeps;
            const int vert_start_idx = draw_list->VtxBuffer.Size;
            draw_list->PathArcTo(wheel_center, (wheel_r_inner + wheel_r_outer)*0.5f, a0, a1, segment_per_arc);
            draw_list->PathStroke(col_white, 0, wheel_thickness);
            const int vert_end_idx = draw_list->VtxBuffer.Size;

            // Paint colors over existing vertices
            ImVec2 gradient_p0(wheel_center.x + ImCos(a0) * wheel_r_inner, wheel_center.y + ImSin(a0) * wheel_r_inner);
            ImVec2 gradient_p1(wheel_center.x + ImCos(a1) * wheel_r_inner, wheel_center.y + ImSin(a1) * wheel_r_inner);
            ShadeVertsLinearColorGradientKeepAlpha(draw_list, vert_start_idx, vert_end_idx, gradient_p0, gradient_p1, col_hues[n], col_hues[n + 1]);
        }

        // Render Cursor + preview on Hue Wheel
        float cos_hue_angle = ImCos(H * 2.0f * IM_PI);
        float sin_hue_angle = ImSin(H * 2.0f * IM_PI);
        ImVec2 hue_cursor_pos(wheel_center.x + cos_hue_angle * (wheel_r_inner + wheel_r_outer) * 0.5f, wheel_center.y + sin_hue_angle * (wheel_r_inner + wheel_r_outer) * 0.5f);
        float hue_cursor_rad = value_changed_h ? wheel_thickness * 0.65f : wheel_thickness * 0.55f;
        int hue_cursor_segments = ImClamp((int)(hue_cursor_rad / 1.4f), 9, 32);
        draw_list->AddCircleFilled(hue_cursor_pos, hue_cursor_rad, hue_color32, hue_cursor_segments);
        draw_list->AddCircle(hue_cursor_pos, hue_cursor_rad + 1, col_midgrey, hue_cursor_segments);
        draw_list->AddCircle(hue_cursor_pos, hue_cursor_rad, col_white, hue_cursor_segments);

        // Render SV triangle (rotated according to hue)
        ImVec2 tra = wheel_center + ImRotate(triangle_pa, cos_hue_angle, sin_hue_angle);
        ImVec2 trb = wheel_center + ImRotate(triangle_pb, cos_hue_angle, sin_hue_angle);
        ImVec2 trc = wheel_center + ImRotate(triangle_pc, cos_hue_angle, sin_hue_angle);
        ImVec2 uv_white = GetFontTexUvWhitePixel();
        draw_list->PrimReserve(6, 6);
        draw_list->PrimVtx(tra, uv_white, hue_color32);
        draw_list->PrimVtx(trb, uv_white, hue_color32);
        draw_list->PrimVtx(trc, uv_white, col_white);
        draw_list->PrimVtx(tra, uv_white, 0);
        draw_list->PrimVtx(trb, uv_white, col_black);
        draw_list->PrimVtx(trc, uv_white, 0);
        draw_list->AddTriangle(tra, trb, trc, col_midgrey, 1.5f);
        sv_cursor_pos = ImLerp(ImLerp(trc, tra, ImSaturate(S)), trb, ImSaturate(1 - V));
    }
    else if (flags & ImGuiColorEditFlags_PickerHueBar)
    {
        // Render SV Square
        draw_list->AddRectFilledMultiColor(picker_pos, picker_pos + ImVec2(sv_picker_size, sv_picker_size), col_white, hue_color32, hue_color32, col_white);
        draw_list->AddRectFilledMultiColor(picker_pos, picker_pos + ImVec2(sv_picker_size, sv_picker_size), 0, 0, col_black, col_black);
        RenderFrameBorder(picker_pos, picker_pos + ImVec2(sv_picker_size, sv_picker_size), 0.0f);
        sv_cursor_pos.x = ImClamp(IM_ROUND(picker_pos.x + ImSaturate(S)     * sv_picker_size), picker_pos.x + 2, picker_pos.x + sv_picker_size - 2); // Sneakily prevent the circle to stick out too much
        sv_cursor_pos.y = ImClamp(IM_ROUND(picker_pos.y + ImSaturate(1 - V) * sv_picker_size), picker_pos.y + 2, picker_pos.y + sv_picker_size - 2);

        // Render Hue Bar
        for (int i = 0; i < 6; ++i)
            draw_list->AddRectFilledMultiColor(ImVec2(bar0_pos_x, picker_pos.y + i * (sv_picker_size / 6)), ImVec2(bar0_pos_x + bars_width, picker_pos.y + (i + 1) * (sv_picker_size / 6)), col_hues[i], col_hues[i], col_hues[i + 1], col_hues[i + 1]);
        float bar0_line_y = IM_ROUND(picker_pos.y + H * sv_picker_size);
        RenderFrameBorder(ImVec2(bar0_pos_x, picker_pos.y), ImVec2(bar0_pos_x + bars_width, picker_pos.y + sv_picker_size), 0.0f);
        RenderArrowsForVerticalBar(draw_list, ImVec2(bar0_pos_x - 1, bar0_line_y), ImVec2(bars_triangles_half_sz + 1, bars_triangles_half_sz), bars_width + 2.0f, style.Alpha);
    }

    // Render cursor/preview circle (clamp S/V within 0..1 range because floating points colors may lead HSV values to be out of range)
    float sv_cursor_rad = value_changed_sv ? 10.0f : 6.0f;
    draw_list->AddCircleFilled(sv_cursor_pos, sv_cursor_rad, user_col32_striped_of_alpha, 12);
    draw_list->AddCircle(sv_cursor_pos, sv_cursor_rad + 1, col_midgrey, 12);
    draw_list->AddCircle(sv_cursor_pos, sv_cursor_rad, col_white, 12);

    // Render alpha bar
    if (alpha_bar)
    {
        float alpha = ImSaturate(col[3]);
        ImRect bar1_bb(bar1_pos_x, picker_pos.y, bar1_pos_x + bars_width, picker_pos.y + sv_picker_size);
        RenderColorRectWithAlphaCheckerboard(draw_list, bar1_bb.Min, bar1_bb.Max, 0, bar1_bb.GetWidth() / 2.0f, ImVec2(0.0f, 0.0f));
        draw_list->AddRectFilledMultiColor(bar1_bb.Min, bar1_bb.Max, user_col32_striped_of_alpha, user_col32_striped_of_alpha, user_col32_striped_of_alpha & ~IM_COL32_A_MASK, user_col32_striped_of_alpha & ~IM_COL32_A_MASK);
        float bar1_line_y = IM_ROUND(picker_pos.y + (1.0f - alpha) * sv_picker_size);
        RenderFrameBorder(bar1_bb.Min, bar1_bb.Max, 0.0f);
        RenderArrowsForVerticalBar(draw_list, ImVec2(bar1_pos_x - 1, bar1_line_y), ImVec2(bars_triangles_half_sz + 1, bars_triangles_half_sz), bars_width + 2.0f, style.Alpha);
    }

    EndGroup();

    if (value_changed && memcmp(backup_initial_col, col, components * sizeof(float)) == 0)
        value_changed = false;
    if (value_changed)
        MarkItemEdited(g.LastItemData.ID);

    PopID();

    return value_changed;
}